

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall luna::Exception::SetWhat<char_const*>(Exception *this,ostringstream *oss,char **arg)

{
  undefined8 *in_RDX;
  ostream *in_RSI;
  Exception *in_RDI;
  
  std::operator<<(in_RSI,(char *)*in_RDX);
  SetWhat(in_RDI,(ostringstream *)in_RSI);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }